

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

uint __thiscall ExecutorRegVm::GetCallStackAddress(ExecutorRegVm *this,uint frame)

{
  RegVmCmd *pRVar1;
  RegVmCmd *pRVar2;
  uint uVar3;
  RegVmCmd **ppRVar4;
  
  uVar3 = 0;
  if (frame < (this->callStack).count) {
    ppRVar4 = FastVector<RegVmCmd_*,_false,_false>::operator[](&this->callStack,frame);
    pRVar1 = *ppRVar4;
    pRVar2 = (this->breakCode).data;
    if ((pRVar1 < pRVar2) || (pRVar2 + (this->breakCode).count <= pRVar1)) {
      uVar3 = (uint)((ulong)((long)pRVar1 - (long)this->codeBase) >> 3);
    }
    else {
      if (pRVar1->code != '\0') {
        __assert_fail("instruction->code == rviNop",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                      ,0x6dd,"unsigned int ExecutorRegVm::GetCallStackAddress(unsigned int)");
      }
      uVar3 = pRVar1->argument;
    }
  }
  return uVar3;
}

Assistant:

unsigned ExecutorRegVm::GetCallStackAddress(unsigned frame)
{
	if(frame >= callStack.size())
		return 0;

	RegVmCmd *instruction = callStack[frame];

	if(instruction >= breakCode.data && instruction < breakCode.data + breakCode.count)
	{
		assert(instruction->code == rviNop);

		return instruction->argument;
	}

	return unsigned(instruction - codeBase);
}